

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpDisassemble::OnOpcodeUint32Uint32
          (BinaryReaderObjdumpDisassemble *this,uint32_t value,uint32_t value2)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  Enum EVar4;
  size_type sVar5;
  const_pointer pvVar6;
  string_view sVar7;
  byte local_49;
  size_t local_40;
  char *local_38;
  undefined1 local_30 [8];
  string_view name;
  uint32_t value2_local;
  uint32_t value_local;
  BinaryReaderObjdumpDisassemble *this_local;
  
  name._M_str._0_4_ = value2;
  name._M_str._4_4_ = value;
  if ((this->in_function_body & 1U) == 0) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    EVar4 = Opcode::operator_cast_to_Enum(&(this->super_BinaryReaderObjdumpBase).current_opcode);
    local_49 = 0;
    if (EVar4 == MemoryInit) {
      sVar7 = anon_unknown_16::BinaryReaderObjdumpBase::GetSegmentName
                        (&this->super_BinaryReaderObjdumpBase,name._M_str._4_4_);
      local_40 = sVar7._M_len;
      local_30 = (undefined1  [8])local_40;
      local_38 = sVar7._M_str;
      name._M_len = (size_t)local_38;
      bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
      local_49 = bVar3 ^ 0xff;
    }
    uVar2 = name._M_str._4_4_;
    uVar1 = (uint32_t)name._M_str;
    if ((local_49 & 1) == 0) {
      LogOpcode(this,"%u %u",(ulong)name._M_str._4_4_,(ulong)(uint32_t)name._M_str);
    }
    else {
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
      pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
      LogOpcode(this,"%u %u <%.*s>",(ulong)uVar2,(ulong)uVar1,sVar5 & 0xffffffff,pvVar6);
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnOpcodeUint32Uint32(uint32_t value,
                                                            uint32_t value2) {
  if (!in_function_body)
    return Result::Ok;
  std::string_view name;
  if (current_opcode == Opcode::MemoryInit &&
      !(name = GetSegmentName(value)).empty()) {
    LogOpcode("%u %u <" PRIstringview ">", value, value2,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else {
    LogOpcode("%u %u", value, value2);
  }
  return Result::Ok;
}